

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
::UseKeyAndValueFromEntry
          (Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
           *this)

{
  MapEntryImpl<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *pMVar1;
  ulong uVar2;
  Value *src;
  Value *dest;
  Arena *arena;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
  local_38;
  
  (*(this->entry_->super_MessageLite)._vptr_MessageLite[0xd])();
  std::__cxx11::string::_M_assign((string *)&this->key_);
  Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>::InnerMap::
  insert<std::__cxx11::string&>(&local_38,this->map_,&this->key_);
  dest = (Value *)&(local_38.first.node_)->field_0x20;
  this->value_ptr_ = dest;
  pMVar1 = this->entry_;
  pMVar1->_has_bits_[0] = pMVar1->_has_bits_[0] | 2;
  uVar2 = (pMVar1->super_MessageLite)._internal_metadata_.ptr_;
  arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  src = pMVar1->value_;
  if (src == (Value *)0x0) {
    src = Arena::CreateMaybeMessage<CoreML::Specification::MILSpec::Value>(arena);
    pMVar1->value_ = src;
    dest = this->value_ptr_;
  }
  MoveHelper<false,_true,_true,_CoreML::Specification::MILSpec::Value>::Move(src,dest);
  return;
}

Assistant:

void UseKeyAndValueFromEntry() {
      // Update key_ in case we need it later (because key() is called).
      // This is potentially inefficient, especially if the key is
      // expensive to copy (e.g., a long string), but this is a cold
      // path, so it's not a big deal.
      key_ = entry_->key();
      value_ptr_ = &(*map_)[key_];
      ValueMover::Move(entry_->mutable_value(), value_ptr_);
    }